

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCore.c
# Opt level: O3

int Inter_ManPerformInterpolation(Aig_Man_t *pAig,Inter_ManParams_t *pPars,int *piFrame)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Inter_Man_t *p;
  Aig_Man_t *pAVar12;
  Cnf_Dat_t *pCVar13;
  Aig_Man_t *pAVar14;
  ulong uVar15;
  void **ppvVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int level;
  int iVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  Inter_Check_t *local_128;
  timespec ts;
  long local_48;
  
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
             CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
  }
  iVar5 = pPars->nSecLimit;
  if ((long)iVar5 == 0) {
    lVar24 = 0;
  }
  else {
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar24 = -1;
    }
    else {
      lVar24 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
    }
    lVar24 = lVar24 + (long)iVar5 * 1000000;
  }
  if (1 < pPars->nFramesK) {
    pPars->fTransLoop = 1;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                  ,0x5e,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                 );
  }
  if (pAig->nTruePis < 1) {
    __assert_fail("Saig_ManPiNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                  ,0x5f,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                 );
  }
  if (pAig->nTruePos - pAig->nConstrs != 1) {
    __assert_fail("Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                  ,0x60,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                 );
  }
  if ((pAig->nConstrs != 0) && (pPars->fVerbose != 0)) {
    printf("Performing interpolation with %d constraints...\n");
  }
  iVar5 = Inter_ManCheckInitialState(pAig);
  if (iVar5 != 0) {
    *piFrame = -1;
    puts("Property trivially fails in the initial state.");
    return 0;
  }
  p = Inter_ManCreate(pAig,pPars);
  if (pPars->fTransLoop == 0) {
    pAVar12 = Inter_ManStartDuplicated(pAig);
  }
  else {
    pAVar12 = Inter_ManStartOneOutput(pAig,0);
  }
  p->pAigTrans = pAVar12;
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar17 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
             CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
  }
  pCVar13 = Cnf_Derive(p->pAigTrans,p->pAigTrans->nRegs);
  p->pCnfAig = pCVar13;
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
             CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar18 + lVar17;
  if (pPars->fVerbose != 0) {
    uVar10 = pAig->nRegs;
    uVar8 = pAig->nTruePis;
    uVar1 = pAig->nTruePos;
    uVar2 = pAig->nObjs[5];
    uVar7 = Aig_ManLevelNum(pAig);
    printf("AIG: PI/PO/Reg = %d/%d/%d. And = %d. Lev = %d.  CNF: Var/Cla = %d/%d.\n",(ulong)uVar8,
           (ulong)uVar1,(ulong)uVar10,(ulong)uVar2,(ulong)uVar7,(ulong)(uint)p->pCnfAig->nVars,
           (ulong)(uint)p->pCnfAig->nClauses);
  }
  *piFrame = -1;
  p->nFrames = 1;
  iVar5 = 0;
  local_48 = 0;
  local_128 = (Inter_Check_t *)0x0;
  do {
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar17 = 1;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
      lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
    }
    if (pPars->fUseBackward == 0) {
      pAVar12 = Inter_ManStartInitState(pAig->nRegs);
    }
    else {
      pAVar12 = Inter_ManStartOneOutput(pAig,1);
    }
    p->pInter = pAVar12;
    if (pAVar12->nObjs[3] != 1) {
      __assert_fail("Aig_ManCoNum(p->pInter) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                    ,0x91,
                    "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)");
    }
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar18 = 1;
    }
    else {
      lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
      lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
    }
    pCVar13 = Cnf_Derive(p->pInter,0);
    p->pCnfInter = pCVar13;
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar19 = -1;
    }
    else {
      lVar19 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
    }
    p->timeCnf = p->timeCnf + lVar19 + lVar18;
    pAVar12 = Inter_ManFramesInter(pAig,p->nFrames,pPars->fUseBackward,pPars->fUseTwoFrames);
    p->pFrames = pAVar12;
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar18 = 1;
    }
    else {
      lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
      lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
    }
    if (pPars->fRewrite != 0) {
      pAVar12 = p->pFrames;
      pAVar14 = Dar_ManRwsat(pAVar12,1,0);
      p->pFrames = pAVar14;
      Aig_ManStop(pAVar12);
    }
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar19 = -1;
    }
    else {
      lVar19 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
    }
    p->timeRwr = p->timeRwr + lVar19 + lVar18;
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar18 = 1;
    }
    else {
      lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
      lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
    }
    pAVar12 = p->pFrames;
    if (pPars->fUseBackward == 0) {
      pCVar13 = Cnf_DeriveSimple(pAVar12,0);
    }
    else {
      pCVar13 = Cnf_Derive(pAVar12,pAVar12->nObjs[3]);
    }
    p->pCnfFrames = pCVar13;
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar19 = -1;
    }
    else {
      lVar19 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
    }
    p->timeCnf = p->timeCnf + lVar19 + lVar18;
    if (pPars->fVerbose != 0) {
      uVar10 = p->nFrames;
      pAVar12 = p->pFrames;
      iVar6 = pAVar12->nObjs[6];
      iVar21 = pAVar12->nObjs[5];
      uVar8 = Aig_ManLevelNum(pAVar12);
      iVar9 = 0xa0fc5c;
      printf("Step = %2d. Frames = 1 + %d. And = %5d. Lev = %5d.  ",(ulong)(iVar5 + 1),(ulong)uVar10
             ,(ulong)(uint)(iVar6 + iVar21),(ulong)uVar8);
      Abc_Print(iVar9,"%s =","Time");
      iVar21 = 3;
      iVar6 = clock_gettime(3,(timespec *)&ts);
      if (iVar6 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      Abc_Print(iVar21,"%9.2f sec\n",(double)(lVar18 + lVar17) / 1000000.0);
    }
    if (((pPars->fTransLoop == 0) && (pPars->fUseBackward == 0)) && (pPars->nFramesK < 2)) {
      local_128 = Inter_CheckStart(p->pAigTrans,pPars->nFramesK);
      iVar6 = clock_gettime(3,(timespec *)&ts);
      if (iVar6 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
      }
      pCVar13 = Cnf_Derive(p->pInter,1);
      iVar6 = clock_gettime(3,(timespec *)&ts);
      if (iVar6 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      p->timeCnf = p->timeCnf + lVar18 + lVar17;
      iVar6 = clock_gettime(3,(timespec *)&ts);
      if (iVar6 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
      }
      Inter_CheckPerform(local_128,pCVar13,lVar24);
      iVar6 = clock_gettime(3,(timespec *)&ts);
      if (iVar6 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      p->timeEqu = p->timeEqu + lVar18 + lVar17;
      Cnf_DataFree(pCVar13);
      pVVar4 = p->vInters;
      if (pVVar4 != (Vec_Ptr_t *)0x0) {
        pAVar12 = Aig_ManDupSimple(p->pInter);
        uVar10 = pVVar4->nSize;
        if (uVar10 == pVVar4->nCap) {
          if ((int)uVar10 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc(0x80);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar16;
            pVVar4->nCap = 0x10;
          }
          else {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc((ulong)uVar10 << 4);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar4->pArray,(ulong)uVar10 << 4);
            }
            pVVar4->pArray = ppvVar16;
            pVVar4->nCap = uVar10 * 2;
          }
        }
        else {
          ppvVar16 = pVVar4->pArray;
        }
        iVar6 = pVVar4->nSize;
        pVVar4->nSize = iVar6 + 1;
        ppvVar16[iVar6] = pAVar12;
      }
    }
    iVar6 = 0;
    uVar15 = 1;
    while( true ) {
      uVar10 = pPars->nFramesMax;
      uVar20 = (ulong)uVar10;
      iVar21 = (int)uVar15;
      if ((uVar10 != 0) && ((int)uVar10 <= p->nFrames + iVar21 + -1)) {
        if (pPars->fVerbose == 0) goto LAB_00640542;
        pcVar23 = "Reached limit (%d) on the number of timeframes.\n";
        goto LAB_0064053b;
      }
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
      }
      iVar9 = Inter_ManPerformOneStep(p,pPars->fUseBias,pPars->fUseBackward,lVar24);
      if (pPars->fVerbose != 0) {
        iVar11 = p->nFrames;
        pAVar12 = p->pInter;
        iVar22 = pAVar12->nObjs[6];
        iVar3 = pAVar12->nObjs[5];
        uVar10 = Aig_ManLevelNum(pAVar12);
        level = 0xa0fcc2;
        printf("   I = %2d. Bmc =%3d. IntAnd =%6d. IntLev =%5d. Conf =%6d.  ",uVar15,
               (ulong)(uint)(iVar11 + iVar21),(ulong)(uint)(iVar22 + iVar3),(ulong)uVar10,
               (ulong)(uint)p->nConfCur);
        Abc_Print(level,"%s =","Time");
        iVar22 = 3;
        iVar11 = clock_gettime(3,(timespec *)&ts);
        if (iVar11 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
        }
        Abc_Print(iVar22,"%9.2f sec\n",(double)(lVar18 + lVar17) / 1000000.0);
      }
      iVar11 = p->nFrames;
      pPars->iFrameMax = iVar21 + iVar11 + -2;
      if (iVar9 != 1) break;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
      }
      pAVar12 = p->pInterNew;
      if (pAVar12 != (Aig_Man_t *)0x0) {
        pAVar12->Time2Quit = lVar24;
        pAVar14 = Dar_ManRwsat(pAVar12,1,0);
        p->pInterNew = pAVar14;
        Aig_ManStop(pAVar12);
        if (p->pInterNew != (Aig_Man_t *)0x0) goto LAB_0063fd1d;
        uVar10 = pPars->nSecLimit;
        pcVar23 = "Reached timeout (%d seconds) during rewriting.\n";
LAB_00640497:
        printf(pcVar23,(ulong)uVar10);
        iVar5 = clock_gettime(3,(timespec *)&ts);
        if (iVar5 < 0) {
          lVar24 = -1;
        }
        else {
          lVar24 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
        }
        p->timeTotal = lVar24 - lVar25;
        iVar5 = 1;
        goto LAB_00640598;
      }
LAB_0063fd1d:
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      p->timeRwr = p->timeRwr + lVar18 + lVar17;
      pAVar12 = p->pInterNew;
      if (pAVar12 == (Aig_Man_t *)0x0) {
LAB_0064037e:
        if (pPars->fVerbose != 0) {
          pcVar23 = "The problem is trivially true for all states.";
LAB_006403ef:
          puts(pcVar23);
        }
LAB_006403f4:
        iVar5 = clock_gettime(3,(timespec *)&ts);
        if (iVar5 < 0) {
          lVar24 = -1;
        }
        else {
          lVar24 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
        }
        p->timeTotal = lVar24 - lVar25;
        iVar5 = 1;
        iVar6 = 1;
        goto LAB_00640452;
      }
      if (pAVar12->vCos->nSize < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*(ulong *)((long)*pAVar12->vCos->pArray + 8) == ((ulong)pAVar12->pConst1 ^ 1))
      goto LAB_0064037e;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
      }
      iVar9 = p->pInterNew->nObjs[2];
      iVar11 = p->pInter->nObjs[2];
      if (pPars->fCheckKstep == 0) {
        if (iVar9 != iVar11) goto LAB_0063fe6b;
        iVar9 = Inter_ManCheckContainment(p->pInterNew,p->pInter);
      }
      else if (iVar9 == iVar11) {
        if (((pPars->fTransLoop == 0) && (pPars->fUseBackward == 0)) && (pPars->nFramesK < 2)) {
          iVar9 = clock_gettime(3,(timespec *)&ts);
          lVar18 = -1;
          lVar19 = -1;
          if (-1 < iVar9) {
            lVar19 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                     CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
          }
          pCVar13 = Cnf_Derive(p->pInterNew,1);
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (-1 < iVar9) {
            lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                     CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
          }
          p->timeCnf = p->timeCnf + (lVar18 - lVar19);
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            local_48 = -1;
          }
          else {
            local_48 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                       CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
          }
          local_48 = local_48 - lVar19;
          iVar9 = Inter_CheckPerform(local_128,pCVar13,lVar24);
          Cnf_DataFree(pCVar13);
          pVVar4 = p->vInters;
          if (pVVar4 != (Vec_Ptr_t *)0x0) {
            pAVar12 = Aig_ManDupSimple(p->pInterNew);
            uVar10 = pVVar4->nSize;
            if (uVar10 == pVVar4->nCap) {
              if ((int)uVar10 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar16 = (void **)malloc(0x80);
                }
                else {
                  ppvVar16 = (void **)realloc(pVVar4->pArray,0x80);
                }
                pVVar4->pArray = ppvVar16;
                pVVar4->nCap = 0x10;
              }
              else {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar16 = (void **)malloc((ulong)uVar10 << 4);
                }
                else {
                  ppvVar16 = (void **)realloc(pVVar4->pArray,(ulong)uVar10 << 4);
                }
                pVVar4->pArray = ppvVar16;
                pVVar4->nCap = uVar10 * 2;
              }
            }
            else {
              ppvVar16 = pVVar4->pArray;
            }
            iVar11 = pVVar4->nSize;
            pVVar4->nSize = iVar11 + 1;
            ppvVar16[iVar11] = pAVar12;
          }
        }
        else {
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar18 = 1;
          }
          else {
            lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                            SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
            lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
                     CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
          }
          iVar9 = pPars->nFramesK;
          if (iVar21 < pPars->nFramesK) {
            iVar9 = iVar21;
          }
          iVar9 = Inter_ManCheckInductiveContainment
                            (p->pAigTrans,p->pInterNew,iVar9,pPars->fUseBackward);
          iVar11 = clock_gettime(3,(timespec *)&ts);
          if (iVar11 < 0) {
            local_48 = -1;
          }
          else {
            local_48 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                       CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
          }
          local_48 = local_48 + lVar18;
        }
      }
      else {
LAB_0063fe6b:
        iVar9 = 0;
      }
      iVar11 = clock_gettime(3,(timespec *)&ts);
      if (iVar11 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      p->timeEqu = p->timeEqu + (lVar17 - local_48) + lVar18;
      if (iVar9 != 0) {
        if (pPars->fVerbose != 0) {
          pcVar23 = "Proved containment of interpolants.";
          goto LAB_006403ef;
        }
        goto LAB_006403f4;
      }
      if (pPars->nSecLimit != 0) {
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
        }
        if (lVar24 < lVar17) {
          uVar10 = pPars->nSecLimit;
          pcVar23 = "Reached timeout (%d seconds).\n";
          goto LAB_00640497;
        }
      }
      if (pPars->fTransLoop == 0) {
        pAVar12 = p->pInter;
        if (pPars->fUseBackward == 0) goto LAB_0063ffac;
        pAVar14 = Aig_ManCreateMiter(pAVar12,p->pInterNew,2);
        p->pInter = pAVar14;
        Aig_ManStop(pAVar12);
        Aig_ManStop(p->pInterNew);
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar17 = 1;
        }
        else {
          lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                          SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
          lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
        }
        pAVar12 = p->pInter;
        pAVar14 = Dar_ManRwsat(pAVar12,1,0);
        p->pInter = pAVar14;
        Aig_ManStop(pAVar12);
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
        }
        p->timeRwr = p->timeRwr + lVar18 + lVar17;
      }
      else {
        pAVar12 = p->pInter;
LAB_0063ffac:
        Aig_ManStop(pAVar12);
        p->pInter = p->pInterNew;
      }
      p->pInterNew = (Aig_Man_t *)0x0;
      Cnf_DataFree(p->pCnfInter);
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
      }
      pCVar13 = Cnf_Derive(p->pInter,0);
      p->pCnfInter = pCVar13;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      p->timeCnf = p->timeCnf + lVar18 + lVar17;
      iVar6 = iVar6 + -1;
      uVar15 = (ulong)(iVar21 + 1);
    }
    if (iVar9 == -1) {
      if (pPars->nSecLimit == 0) {
LAB_0064051e:
        uVar20 = (ulong)(uint)p->nConfLimit;
        if (p->nConfCur < p->nConfLimit) {
          __assert_fail("p->nConfCur >= p->nConfLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                        ,0x10d,
                        "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                       );
        }
        if (pPars->fVerbose == 0) goto LAB_00640542;
        pcVar23 = "Reached limit (%d) on the number of conflicts.\n";
      }
      else {
        iVar5 = clock_gettime(3,(timespec *)&ts);
        if (iVar5 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                   CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
        }
        if (lVar17 <= lVar24) goto LAB_0064051e;
        if (pPars->fVerbose == 0) goto LAB_00640542;
        uVar20 = (ulong)(uint)pPars->nSecLimit;
        pcVar23 = "Reached timeout (%d seconds).\n";
      }
LAB_0064053b:
      printf(pcVar23,uVar20);
LAB_00640542:
      iVar5 = clock_gettime(3,(timespec *)&ts);
      if (iVar5 < 0) {
        lVar24 = -1;
      }
      else {
        lVar24 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
                 CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
      }
      p->timeTotal = lVar24 - lVar25;
      iVar5 = 0;
LAB_00640598:
      Inter_ManStop(p,iVar5);
      Inter_CheckStop(local_128);
      return -1;
    }
    if (iVar9 != 0) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                    ,0x116,
                    "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)");
    }
    if (iVar6 == 0) break;
    p->nFrames = iVar11 - iVar6;
    Inter_ManClean(p);
    Inter_CheckStop(local_128);
    iVar5 = iVar5 + 1;
  } while( true );
  if (pPars->fVerbose != 0) {
    printf("Found a real counterexample in frame %d.\n");
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar24 = -1;
  }
  else {
    lVar24 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
             CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
  }
  p->timeTotal = lVar24 - lVar25;
  *piFrame = p->nFrames;
  Saig_ParBmcSetDefaultParams((Saig_ParBmc_t *)&ts);
  ts.tv_nsec._0_4_ = 100000000;
  ts.tv_sec._0_4_ = p->nFrames;
  iVar5 = Saig_ManBmcScalable(pAig,(Saig_ParBmc_t *)&ts);
  if (iVar5 == 1) {
    pcVar23 = "Error: The problem should be SAT but it is UNSAT.";
  }
  else {
    if (iVar5 != -1) goto LAB_00640680;
    pcVar23 = "Error: The problem timed out.";
  }
  puts(pcVar23);
LAB_00640680:
  iVar5 = 0;
  iVar6 = 0;
LAB_00640452:
  Inter_ManStop(p,iVar6);
  Inter_CheckStop(local_128);
  return iVar5;
}

Assistant:

int Inter_ManPerformInterpolation( Aig_Man_t * pAig, Inter_ManParams_t * pPars, int * piFrame )
{
    extern int Inter_ManCheckInductiveContainment( Aig_Man_t * pTrans, Aig_Man_t * pInter, int nSteps, int fBackward );
    Inter_Man_t * p;
    Inter_Check_t * pCheck = NULL;
    Aig_Man_t * pAigTemp;
    int s, i, RetValue, Status;
    abctime clk, clk2, clkTotal = Abc_Clock(), timeTemp = 0;
    abctime nTimeNewOut = pPars->nSecLimit ? pPars->nSecLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;

    // enable ORing of the interpolants, if containment check is performed inductively with K > 1
    if ( pPars->nFramesK > 1 )
        pPars->fTransLoop = 1;

    // sanity checks
    assert( Saig_ManRegNum(pAig) > 0 );
    assert( Saig_ManPiNum(pAig) > 0 );
    assert( Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1 );
    if ( pPars->fVerbose && Saig_ManConstrNum(pAig) )
        printf( "Performing interpolation with %d constraints...\n", Saig_ManConstrNum(pAig) );

    if ( Inter_ManCheckInitialState(pAig) )
    {
        *piFrame = -1;
        printf( "Property trivially fails in the initial state.\n" );
        return 0;
    }
/*
    if ( Inter_ManCheckAllStates(pAig) )
    {
        printf( "Property trivially holds in all states.\n" );
        return 1;
    }
*/
    // create interpolation manager
    // can perform SAT sweeping and/or rewriting of this AIG...
    p = Inter_ManCreate( pAig, pPars );
    if ( pPars->fTransLoop )
        p->pAigTrans = Inter_ManStartOneOutput( pAig, 0 );
    else
        p->pAigTrans = Inter_ManStartDuplicated( pAig );
    // derive CNF for the transformed AIG
clk = Abc_Clock();
    p->pCnfAig = Cnf_Derive( p->pAigTrans, Aig_ManRegNum(p->pAigTrans) ); 
p->timeCnf += Abc_Clock() - clk;    
    if ( pPars->fVerbose )
    { 
        printf( "AIG: PI/PO/Reg = %d/%d/%d. And = %d. Lev = %d.  CNF: Var/Cla = %d/%d.\n",
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig), 
            Aig_ManAndNum(pAig), Aig_ManLevelNum(pAig),
            p->pCnfAig->nVars, p->pCnfAig->nClauses );
    }
 
    // derive interpolant
    *piFrame = -1;
    p->nFrames = 1;
    for ( s = 0; ; s++ )
    {
        Cnf_Dat_t * pCnfInter2;

clk2 = Abc_Clock();
        // initial state
        if ( pPars->fUseBackward )
            p->pInter = Inter_ManStartOneOutput( pAig, 1 );
        else
            p->pInter = Inter_ManStartInitState( Aig_ManRegNum(pAig) );
        assert( Aig_ManCoNum(p->pInter) == 1 );
clk = Abc_Clock();
        p->pCnfInter = Cnf_Derive( p->pInter, 0 );  
p->timeCnf += Abc_Clock() - clk;    
        // timeframes
        p->pFrames = Inter_ManFramesInter( pAig, p->nFrames, pPars->fUseBackward, pPars->fUseTwoFrames );
clk = Abc_Clock();
        if ( pPars->fRewrite )
        {
            p->pFrames = Dar_ManRwsat( pAigTemp = p->pFrames, 1, 0 );
            Aig_ManStop( pAigTemp );
//        p->pFrames = Fra_FraigEquivence( pAigTemp = p->pFrames, 100, 0 );
//        Aig_ManStop( pAigTemp );
        }
p->timeRwr += Abc_Clock() - clk;
        // can also do SAT sweeping on the timeframes...
clk = Abc_Clock();
        if ( pPars->fUseBackward )
            p->pCnfFrames = Cnf_Derive( p->pFrames, Aig_ManCoNum(p->pFrames) );  
        else
//            p->pCnfFrames = Cnf_Derive( p->pFrames, 0 );  
            p->pCnfFrames = Cnf_DeriveSimple( p->pFrames, 0 );  
p->timeCnf += Abc_Clock() - clk;    
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "Step = %2d. Frames = 1 + %d. And = %5d. Lev = %5d.  ", 
                s+1, p->nFrames, Aig_ManNodeNum(p->pFrames), Aig_ManLevelNum(p->pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk2 );
        }


        //////////////////////////////////////////
        // start containment checking
        if ( !(pPars->fTransLoop || pPars->fUseBackward || pPars->nFramesK > 1) )
        {
            pCheck = Inter_CheckStart( p->pAigTrans, pPars->nFramesK );
            // try new containment check for the initial state
clk = Abc_Clock();
            pCnfInter2 = Cnf_Derive( p->pInter, 1 );  
p->timeCnf += Abc_Clock() - clk;    
clk = Abc_Clock();
            RetValue = Inter_CheckPerform( pCheck, pCnfInter2, nTimeNewOut );
p->timeEqu += Abc_Clock() - clk;
//            assert( RetValue == 0 );
            Cnf_DataFree( pCnfInter2 );
            if ( p->vInters )
                Vec_PtrPush( p->vInters, Aig_ManDupSimple(p->pInter) );
        }
        //////////////////////////////////////////

        // iterate the interpolation procedure
        for ( i = 0; ; i++ )
        {
            if ( pPars->nFramesMax && p->nFrames + i >= pPars->nFramesMax )
            { 
                if ( pPars->fVerbose )
                    printf( "Reached limit (%d) on the number of timeframes.\n", pPars->nFramesMax );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 0 );
                Inter_CheckStop( pCheck );
                return -1;
            }

            // perform interpolation
            clk = Abc_Clock();
#ifdef ABC_USE_LIBRARIES
            if ( pPars->fUseMiniSat )
            {
                assert( !pPars->fUseBackward );
                RetValue = Inter_ManPerformOneStepM114p( p, pPars->fUsePudlak, pPars->fUseOther );
            }
            else 
#endif
                RetValue = Inter_ManPerformOneStep( p, pPars->fUseBias, pPars->fUseBackward, nTimeNewOut );

            if ( pPars->fVerbose )
            {
                printf( "   I = %2d. Bmc =%3d. IntAnd =%6d. IntLev =%5d. Conf =%6d.  ", 
                    i+1, i + 1 + p->nFrames, Aig_ManNodeNum(p->pInter), Aig_ManLevelNum(p->pInter), p->nConfCur );
                ABC_PRT( "Time", Abc_Clock() - clk );
            }
            // remember the number of timeframes completed
            pPars->iFrameMax = i - 1 + p->nFrames;
            if ( RetValue == 0 ) // found a (spurious?) counter-example
            {
                if ( i == 0 ) // real counterexample
                {
                    if ( pPars->fVerbose )
                        printf( "Found a real counterexample in frame %d.\n", p->nFrames );
                    p->timeTotal = Abc_Clock() - clkTotal;
                    *piFrame = p->nFrames;
//                    pAig->pSeqModel = (Abc_Cex_t *)Inter_ManGetCounterExample( pAig, p->nFrames+1, pPars->fVerbose );
                    {
                        int RetValue;
                        Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
                        Saig_ParBmcSetDefaultParams( pParsBmc );
                        pParsBmc->nConfLimit = 100000000;
                        pParsBmc->nStart     = p->nFrames;
                        pParsBmc->fVerbose   = pPars->fVerbose;
                        RetValue = Saig_ManBmcScalable( pAig, pParsBmc );
                        if ( RetValue == 1 )
                            printf( "Error: The problem should be SAT but it is UNSAT.\n" );
                        else if ( RetValue == -1 )
                            printf( "Error: The problem timed out.\n" );
                    }
                    Inter_ManStop( p, 0 );
                    Inter_CheckStop( pCheck );
                    return 0;
                }
                // likely spurious counter-example
                p->nFrames += i;
                Inter_ManClean( p ); 
                break;
            }
            else if ( RetValue == -1 ) 
            {
                if ( pPars->nSecLimit && Abc_Clock() > nTimeNewOut ) // timed out
                {
                    if ( pPars->fVerbose )
                        printf( "Reached timeout (%d seconds).\n",  pPars->nSecLimit );
                }
                else
                {
                    assert( p->nConfCur >= p->nConfLimit );
                    if ( pPars->fVerbose )
                        printf( "Reached limit (%d) on the number of conflicts.\n", p->nConfLimit );
                }
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 0 );
                Inter_CheckStop( pCheck );
                return -1;
            }
            assert( RetValue == 1 ); // found new interpolant
            // compress the interpolant
clk = Abc_Clock();
            if ( p->pInterNew )
            {
                // save the timeout value
                p->pInterNew->Time2Quit = nTimeNewOut;
//                Ioa_WriteAiger( p->pInterNew, "interpol.aig", 0, 0 );
                p->pInterNew = Dar_ManRwsat( pAigTemp = p->pInterNew, 1, 0 );
//                p->pInterNew = Dar_ManRwsat( pAigTemp = p->pInterNew, 0, 0 );
                Aig_ManStop( pAigTemp );
                if ( p->pInterNew == NULL )
                {
                    printf( "Reached timeout (%d seconds) during rewriting.\n",  pPars->nSecLimit );
                    p->timeTotal = Abc_Clock() - clkTotal;
                    Inter_ManStop( p, 1 );
                    Inter_CheckStop( pCheck );
                    return -1;
                }
            }
p->timeRwr += Abc_Clock() - clk;

            // check if interpolant is trivial
            if ( p->pInterNew == NULL || Aig_ObjChild0(Aig_ManCo(p->pInterNew,0)) == Aig_ManConst0(p->pInterNew) )
            { 
//                printf( "interpolant is constant 0\n" );
                if ( pPars->fVerbose )
                    printf( "The problem is trivially true for all states.\n" );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return 1;
            }

            // check containment of interpolants
clk = Abc_Clock();
            if ( pPars->fCheckKstep ) // k-step unique-state induction
            {
                if ( Aig_ManCiNum(p->pInterNew) == Aig_ManCiNum(p->pInter) )
                {
                    if ( pPars->fTransLoop || pPars->fUseBackward || pPars->nFramesK > 1 )
                    {
clk2 = Abc_Clock();
                        Status = Inter_ManCheckInductiveContainment( p->pAigTrans, p->pInterNew, Abc_MinInt(i + 1, pPars->nFramesK), pPars->fUseBackward );
timeTemp = Abc_Clock() - clk2;
                    }
                    else
                    {   // new containment check
clk2 = Abc_Clock();
                        pCnfInter2 = Cnf_Derive( p->pInterNew, 1 );  
p->timeCnf += Abc_Clock() - clk2;
timeTemp = Abc_Clock() - clk2;
            
                        Status = Inter_CheckPerform( pCheck, pCnfInter2, nTimeNewOut );
                        Cnf_DataFree( pCnfInter2 );
                        if ( p->vInters )
                            Vec_PtrPush( p->vInters, Aig_ManDupSimple(p->pInterNew) );
                    }
                }
                else
                    Status = 0;
            }
            else // combinational containment
            {
                if ( Aig_ManCiNum(p->pInterNew) == Aig_ManCiNum(p->pInter) )
                    Status = Inter_ManCheckContainment( p->pInterNew, p->pInter );
                else
                    Status = 0;
            }
p->timeEqu += Abc_Clock() - clk - timeTemp;
            if ( Status ) // contained
            {
                if ( pPars->fVerbose )
                    printf( "Proved containment of interpolants.\n" );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return 1;
            }
            if ( pPars->nSecLimit && Abc_Clock() > nTimeNewOut )
            {
                printf( "Reached timeout (%d seconds).\n",  pPars->nSecLimit );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return -1;
            }
            // save interpolant and convert it into CNF
            if ( pPars->fTransLoop )
            {
                Aig_ManStop( p->pInter );
                p->pInter = p->pInterNew; 
            }
            else
            {
                if ( pPars->fUseBackward )
                {
                    p->pInter = Aig_ManCreateMiter( pAigTemp = p->pInter, p->pInterNew, 2 );
                    Aig_ManStop( pAigTemp );
                    Aig_ManStop( p->pInterNew );
                    // compress the interpolant
clk = Abc_Clock();
                    p->pInter = Dar_ManRwsat( pAigTemp = p->pInter, 1, 0 );
                    Aig_ManStop( pAigTemp );
p->timeRwr += Abc_Clock() - clk;
                }
                else // forward with the new containment checking (using only the frontier)
                {
                    Aig_ManStop( p->pInter );
                    p->pInter = p->pInterNew; 
                }
            }
            p->pInterNew = NULL;
            Cnf_DataFree( p->pCnfInter );
clk = Abc_Clock();
            p->pCnfInter = Cnf_Derive( p->pInter, 0 );  
p->timeCnf += Abc_Clock() - clk;
        }

        // start containment checking
        Inter_CheckStop( pCheck );
    }
    assert( 0 );
    return RetValue;
}